

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
          (anon_unknown_0 *this,
          CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep,
          RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage)

{
  anon_unknown_0 aVar1;
  int iVar2;
  long lVar3;
  sbyte sVar4;
  Nonnull<const_CordRep_*> pCVar5;
  sbyte sVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  dVar8 = rep.fraction;
  pCVar5 = rep.rep;
  if (this == (anon_unknown_0 *)0x0) {
    __assert_fail("edge != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                  ,0x21,"bool absl::cord_internal::IsDataEdge(const CordRep *)");
  }
  aVar1 = this[0xc];
  if ((byte)aVar1 < 5) {
    if ((aVar1 != (anon_unknown_0)0x1) ||
       (this = *(anon_unknown_0 **)(this + 0x18), (byte)this[0xc] < 5)) {
      __assert_fail("IsDataEdge(rep.rep)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord_analysis.cc"
                    ,0x78,
                    "void absl::cord_internal::(anonymous namespace)::AnalyzeDataEdge(CordRepRef<mode>, RawUsage<mode> &) [mode = absl::cord_internal::(anonymous namespace)::Mode::kFairShare]"
                   );
    }
    pCVar5->length = (size_t)(dVar8 * 32.0 + (double)pCVar5->length);
    iVar2 = *(int *)(this + 8) >> 1;
    auVar9._8_4_ = *(int *)(this + 8) >> 0x1f;
    auVar9._0_8_ = (long)iVar2;
    auVar9._12_4_ = 0x45300000;
    dVar8 = dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0));
    aVar1 = this[0xc];
  }
  if ((byte)aVar1 < 6) {
    lVar3 = *(long *)this + 0x28;
  }
  else {
    if (0xf8 < (byte)aVar1) {
      __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                    ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
    }
    iVar2 = -0xb8000;
    if ((byte)aVar1 < 0xbb) {
      iVar2 = -0xe80;
    }
    sVar6 = 0xc;
    if ((byte)aVar1 < 0xbb) {
      sVar6 = 6;
    }
    iVar7 = -0x10;
    if (0x42 < (byte)aVar1) {
      iVar7 = iVar2;
    }
    sVar4 = 3;
    if (0x42 < (byte)aVar1) {
      sVar4 = sVar6;
    }
    lVar3 = (long)(int)(((uint)(byte)aVar1 << sVar4) + iVar7);
  }
  auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar10._0_8_ = lVar3;
  auVar10._12_4_ = 0x45300000;
  pCVar5->length =
       (size_t)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * dVar8 +
               (double)pCVar5->length);
  return;
}

Assistant:

void AnalyzeDataEdge(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  assert(IsDataEdge(rep.rep));

  // Consume all substrings
  if (rep.rep->tag == SUBSTRING) {
    raw_usage.Add(sizeof(CordRepSubstring), rep);
    rep = rep.Child(rep.rep->substring()->child);
  }

  // Consume FLAT / EXTERNAL
  const size_t size =
      rep.rep->tag >= FLAT
          ? rep.rep->flat()->AllocatedSize()
          : rep.rep->length + sizeof(CordRepExternalImpl<intptr_t>);
  raw_usage.Add(size, rep);
}